

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O2

void __thiscall google::CapturedStream::Capture(CapturedStream *this)

{
  int iVar1;
  ostream *poVar2;
  FileDescriptor cap_fd;
  FileDescriptor local_7c;
  LogMessage local_78;
  
  if ((this->uncaptured_fd_).fd_ == -1) {
    iVar1 = dup(this->fd_);
    glog_internal_namespace_::FileDescriptor::safe_close(&this->uncaptured_fd_);
    (this->uncaptured_fd_).fd_ = iVar1;
    if (iVar1 == -1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                 ,0x138);
      poVar2 = LogMessage::stream(&local_78);
      std::operator<<(poVar2,"Check failed: uncaptured_fd_ ");
    }
    else {
      iVar1 = open((this->filename_)._M_dataplus._M_p,0x241,0x180);
      local_7c.fd_ = iVar1;
      if (iVar1 == -1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                   ,0x13d);
        poVar2 = LogMessage::stream(&local_78);
        std::operator<<(poVar2,"Check failed: cap_fd ");
      }
      else {
        fflush((FILE *)0x0);
        iVar1 = dup2(iVar1,this->fd_);
        if (iVar1 == -1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                     ,0x141);
          poVar2 = LogMessage::stream(&local_78);
          std::operator<<(poVar2,"Check failed: dup2(cap_fd.get(), fd_) != -1 ");
        }
        else {
          iVar1 = glog_internal_namespace_::FileDescriptor::unsafe_close(&local_7c);
          if (iVar1 != -1) {
            glog_internal_namespace_::FileDescriptor::safe_close(&local_7c);
            return;
          }
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                     ,0x142);
          poVar2 = LogMessage::stream(&local_78);
          std::operator<<(poVar2,"Check failed: cap_fd.close() != -1 ");
        }
      }
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x136);
    poVar2 = LogMessage::stream(&local_78);
    poVar2 = std::operator<<(poVar2,"Check failed: !uncaptured_fd_ ");
    poVar2 = std::operator<<(poVar2,", Stream ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fd_);
    std::operator<<(poVar2," already captured!");
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

void Capture() {
    // Keep original stream for later
    CHECK(!uncaptured_fd_) << ", Stream " << fd_ << " already captured!";
    uncaptured_fd_.reset(dup(fd_));
    CHECK(uncaptured_fd_);

    // Open file to save stream to
    FileDescriptor cap_fd{open(filename_.c_str(), O_CREAT | O_TRUNC | O_WRONLY,
                               S_IRUSR | S_IWUSR)};
    CHECK(cap_fd);

    // Send stdout/stderr to this file
    fflush(nullptr);
    CHECK(dup2(cap_fd.get(), fd_) != -1);
    CHECK(cap_fd.close() != -1);
  }